

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_read_cstr_unchecked
               (mpack_reader_t *reader,char *buf,size_t buffer_size,size_t byte_count)

{
  if (reader->error == mpack_ok) {
    if (buffer_size - 1 < byte_count) {
      mpack_reader_flag_error(reader,mpack_error_too_big);
    }
    else {
      mpack_read_native(reader,buf,byte_count);
      buf = buf + byte_count;
    }
  }
  *buf = '\0';
  return;
}

Assistant:

static void mpack_read_cstr_unchecked(mpack_reader_t* reader, char* buf, size_t buffer_size, size_t byte_count) {
    mpack_assert(buf != NULL, "destination for read of %i bytes is NULL", (int)byte_count);
    mpack_assert(buffer_size >= 1, "buffer size is zero; you must have room for at least a null-terminator");

    if (mpack_reader_error(reader)) {
        buf[0] = 0;
        return;
    }

    if (byte_count > buffer_size - 1) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        buf[0] = 0;
        return;
    }

    mpack_reader_track_str_bytes_all(reader, byte_count);
    mpack_read_native(reader, buf, byte_count);
    buf[byte_count] = 0;
}